

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  pointer pcVar1;
  size_type sVar2;
  char extraout_DL;
  char chr;
  char extraout_DL_00;
  size_type sVar3;
  ostringstream os;
  string sStack_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = (txt->_M_dataplus)._M_p;
  sVar2 = txt->_M_string_length;
  chr = extraout_DL;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    transformed_abi_cxx11_(&sStack_1c8,(lest *)(ulong)(uint)(int)pcVar1[sVar3],chr);
    std::operator<<((ostream *)local_1a8,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    chr = extraout_DL_00;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_tran_string( std::string const & txt ) { std::ostringstream os; for(auto c:txt) os << transformed(c); return os.str(); }